

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall Parser::parse_subroutine(Parser *this)

{
  string *type_token;
  string *__rhs;
  VM_Writer *pVVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string name;
  string return_type;
  allocator<char> local_aa;
  allocator<char> local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  poVar4 = std::operator<<((ostream *)this->out_file,"\t<subroutine>");
  std::endl<char,std::char_traits<char>>(poVar4);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  local_48._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_48.field_2._M_local_buf[0] = '\0';
  poVar4 = (ostream *)this->out_file;
  __rhs = &this->cur_subroutine_type;
  std::operator+(&local_88,"\t\t<keyword>",__rhs);
  std::operator+(&local_a8,&local_88,"</keyword>");
  poVar4 = std::operator<<(poVar4,(string *)&local_a8);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  bVar2 = std::operator==(__rhs,"constructor");
  if (bVar2) {
    Tokenizer::get_current_token_abi_cxx11_(&local_a8,this->tokenizer);
    bVar2 = std::operator!=(&local_a8,&this->class_name);
    std::__cxx11::string::~string((string *)&local_a8);
    if (bVar2) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Invalid constructor identifier");
      std::endl<char,std::char_traits<char>>(poVar4);
      exit(0);
    }
    query_tokenizer(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"new",(allocator<char> *)&local_88);
    check_expected_x_after_y(this,&local_a8,&this->class_name);
    std::__cxx11::string::~string((string *)&local_a8);
    poVar4 = (ostream *)this->out_file;
    std::operator+(&local_88,"\t\t<keyword>",&this->cur_token);
    std::operator+(&local_a8,&local_88,"</keyword>");
    poVar4 = std::operator<<(poVar4,(string *)&local_a8);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
LAB_0013231c:
    query_tokenizer(this);
  }
  else {
    type_token = &this->cur_token;
    bVar2 = Tokenizer::type_exists(this->tokenizer,type_token);
    if (bVar2) {
LAB_001321fc:
      std::__cxx11::string::_M_assign((string *)&local_48);
      poVar4 = (ostream *)this->out_file;
      std::operator+(&local_88,"\t\t<keyword>",type_token);
      std::operator+(&local_a8,&local_88,"</keyword>");
      poVar4 = std::operator<<(poVar4,(string *)&local_a8);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_88);
      query_tokenizer(this);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"IDENTIFIER",&local_a9)
      ;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"subroutine definition",&local_aa);
      check_token_type_x_after_y(this,&local_a8,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
      poVar4 = (ostream *)this->out_file;
      std::operator+(&local_88,"\t\t<identifier>",type_token);
      std::operator+(&local_a8,&local_88,"</identifier>");
      poVar4 = std::operator<<(poVar4,(string *)&local_a8);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::_M_assign((string *)&local_68);
      goto LAB_0013231c;
    }
    bVar2 = std::operator==(type_token,"void");
    if (bVar2) goto LAB_001321fc;
    std::operator+(&local_88,"Compiler Error: \'",type_token);
    std::operator+(&local_a8,&local_88,"\' not a valid type for a subroutine");
    poVar4 = std::operator<<((ostream *)&std::cerr,(string *)&local_a8);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"(",&local_a9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"identifier",&local_aa);
  check_expected_x_after_y(this,&local_a8,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  poVar4 = std::operator<<((ostream *)this->out_file,"\t\t<symbol>(</symbol>");
  std::endl<char,std::char_traits<char>>(poVar4);
  query_tokenizer(this);
  bVar2 = std::operator==(__rhs,"constructor");
  if (bVar2) {
    parse_param_list(this);
    pVVar1 = this->vm_writer;
    std::operator+(&local_88,&this->class_name,".");
    std::operator+(&local_a8,&local_88,&local_68);
    iVar3 = Symbol_Table::get_temp_arg_count(&this->symbol_table);
    VM_Writer::write_function(pVVar1,&local_a8,iVar3);
    std::__cxx11::string::~string((string *)&local_a8);
    this_00 = &local_88;
  }
  else {
    bVar2 = std::operator==(__rhs,"function");
    if (bVar2) {
      parse_param_list(this);
      iVar3 = Symbol_Table::get_temp_arg_count(&this->symbol_table);
      pVVar1 = this->vm_writer;
      std::operator+(&local_88,&this->class_name,".");
      std::operator+(&local_a8,&local_88,&local_68);
      VM_Writer::write_function(pVVar1,&local_a8,iVar3);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"function",(allocator<char> *)&local_88);
      Symbol_Table::set_function_data(&this->symbol_table,&local_68,&local_a8,iVar3);
    }
    else {
      parse_param_list(this);
      iVar3 = Symbol_Table::get_temp_arg_count(&this->symbol_table);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"method",(allocator<char> *)&local_88);
      Symbol_Table::set_function_data(&this->symbol_table,&local_68,&local_a8,iVar3);
      std::__cxx11::string::~string((string *)&local_a8);
      pVVar1 = this->vm_writer;
      std::operator+(&local_88,&this->class_name,".");
      std::operator+(&local_a8,&local_88,&local_68);
      VM_Writer::write_function(pVVar1,&local_a8,iVar3 + 1);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_88);
      pVVar1 = this->vm_writer;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"argument",(allocator<char> *)&local_88);
      VM_Writer::write_push(pVVar1,&local_a8,0);
      std::__cxx11::string::~string((string *)&local_a8);
      pVVar1 = this->vm_writer;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"this",(allocator<char> *)&local_88);
      VM_Writer::write_pop(pVVar1,&local_a8,0);
    }
    this_00 = &local_a8;
  }
  std::__cxx11::string::~string((string *)this_00);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,")",&local_a9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"parameter list",&local_aa)
  ;
  check_expected_x_after_y(this,&local_a8,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  poVar4 = std::operator<<((ostream *)this->out_file,"\t\t<symbol>)</symbol>");
  std::endl<char,std::char_traits<char>>(poVar4);
  query_tokenizer(this);
  parse_subroutine_body(this);
  bVar2 = std::operator==(__rhs,"function");
  if (!bVar2) {
    bVar2 = std::operator==(&local_48,"void");
    if (!bVar2) goto LAB_0013269d;
  }
  pVVar1 = this->vm_writer;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"constant",(allocator<char> *)&local_88);
  VM_Writer::write_push(pVVar1,&local_a8,0);
  std::__cxx11::string::~string((string *)&local_a8);
LAB_0013269d:
  VM_Writer::write_return(this->vm_writer);
  poVar4 = std::operator<<((ostream *)this->out_file,"\t</subroutine>");
  std::endl<char,std::char_traits<char>>(poVar4);
  Symbol_Table::start_subroutine(&this->symbol_table);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void Parser::parse_subroutine() {
    out_file << "\t<subroutine>" << std::endl;

    std::string name, return_type;
    out_file << "\t\t<keyword>" + cur_subroutine_type + "</keyword>" << std::endl;

    if (cur_subroutine_type == "constructor") {
        if (tokenizer.get_current_token() != class_name) {
            std::cerr << "Invalid constructor identifier" << std::endl;
            exit(0);
        }

        query_tokenizer();

        check_expected_x_after_y("new", class_name);
        out_file << "\t\t<keyword>" + cur_token + "</keyword>" << std::endl;
        query_tokenizer();
    }

    else if (tokenizer.type_exists(cur_token) || cur_token == "void") {
        return_type = cur_token;
        out_file << "\t\t<keyword>" + cur_token + "</keyword>" << std::endl;
        query_tokenizer();

        check_token_type_x_after_y("IDENTIFIER", "subroutine definition");
        out_file << "\t\t<identifier>" + cur_token + "</identifier>" << std::endl;
        name = cur_token;
        query_tokenizer();
    }
    else {
        std::cerr << "Compiler Error: '" + cur_token + "' not a valid type for a subroutine"
        << std::endl;
    }
    check_expected_x_after_y("(", "identifier");
    out_file << "\t\t<symbol>(</symbol>" << std::endl;
    query_tokenizer();

    if (cur_subroutine_type == "constructor") {
        parse_param_list();
        vm_writer.write_function(class_name+"."+name, symbol_table.get_temp_arg_count());
    }
    else if (cur_subroutine_type == "function") {
        parse_param_list();
        int n_args = symbol_table.get_temp_arg_count();
        vm_writer.write_function(class_name + "." + name, n_args);
        symbol_table.set_function_data(name, "function", n_args);

    }
    else {
        parse_param_list();
        int n_args = symbol_table.get_temp_arg_count();
        symbol_table.set_function_data(name, "method", n_args);
        vm_writer.write_function(class_name + "." + name, n_args + 1);
        vm_writer.write_push("argument", 0);
        vm_writer.write_pop("this", 0);

    }


    check_expected_x_after_y(")", "parameter list");
    out_file << "\t\t<symbol>)</symbol>" << std::endl;

    query_tokenizer();
    parse_subroutine_body();

    // functions and void return type methods are specified to return 0;
    if (cur_subroutine_type == "function" || return_type == "void") {
        vm_writer.write_push("constant", 0);
    }
    vm_writer.write_return();
    out_file << "\t</subroutine>" << std::endl;
    symbol_table.start_subroutine();
}